

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fwrite(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_context *pCtx_00;
  int iVar1;
  char *pcVar2;
  char *local_60;
  int local_44;
  int n;
  int nLen;
  io_private *pDev;
  char *zString;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pStream = (jx9_io_stream *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 2) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting an IO handle");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    _n = (long *)jx9_value_to_resource((jx9_value *)pStream->zName);
    pCtx_00 = pjStack_18;
    if ((_n == (long *)0x0) || (*(int *)((long)_n + 0x34) != 0xfeac14)) {
      jx9_context_throw_error(pjStack_18,2,"Expecting an IO handle");
      jx9_result_bool(pjStack_18,0);
    }
    else {
      zString = (char *)*_n;
      if ((zString == (char *)0x0) || (*(long *)(zString + 0x40) == 0)) {
        pcVar2 = jx9_function_name(pjStack_18);
        if (zString == (char *)0x0) {
          local_60 = "null_stream";
        }
        else {
          local_60 = *(char **)zString;
        }
        jx9_context_throw_error_format
                  (pCtx_00,2,
                   "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                   ,pcVar2,local_60);
        jx9_result_bool(pjStack_18,0);
      }
      else {
        pDev = (io_private *)jx9_value_to_string(*(jx9_value **)&pStream->iVersion,&local_44);
        if (((2 < apArg_local._4_4_) &&
            (iVar1 = jx9_value_to_int((jx9_value *)pStream->xOpen), -1 < iVar1)) &&
           (iVar1 < local_44)) {
          local_44 = iVar1;
        }
        if (local_44 < 1) {
          jx9_result_int(pjStack_18,0);
        }
        else {
          iVar1 = (**(code **)(zString + 0x40))(_n[1],pDev,(long)local_44);
          if (iVar1 < 0) {
            jx9_result_bool(pjStack_18,0);
          }
          else {
            jx9_result_int(pjStack_18,iVar1);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_fwrite(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zString;
	io_private *pDev;
	int nLen, n;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/* Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xWrite == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the data to write */
	zString = jx9_value_to_string(apArg[1], &nLen);
	if( nArg > 2 ){
		/* Maximum data length to write */
		n = jx9_value_to_int(apArg[2]);
		if( n >= 0 && n < nLen ){
			nLen = n;
		}
	}
	if( nLen < 1 ){
		/* Nothing to write */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	n = (int)pStream->xWrite(pDev->pHandle, (const void *)zString, nLen);
	if( n <  0 ){
		/* IO error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* #Bytes written */
		jx9_result_int(pCtx, n);
	}
	return JX9_OK;
}